

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O2

int libwebvtt::Parser::ParseTime(string *line,size_type *idx_ptr,Time *time)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  size_type sVar6;
  pointer pcVar7;
  
  uVar2 = 0xffffffff;
  uVar3 = uVar2;
  if ((((idx_ptr != (size_type *)0x0) && (uVar5 = *idx_ptr, uVar5 != 0xffffffffffffffff)) &&
      (time != (Time *)0x0)) && (uVar5 < line->_M_string_length)) {
    pcVar7 = (line->_M_dataplus)._M_p;
    while( true ) {
      cVar1 = pcVar7[uVar5];
      if ((cVar1 != ' ') && (cVar1 != '\t')) break;
      *idx_ptr = uVar5 + 1;
      uVar5 = uVar5 + 1;
    }
    uVar3 = ParseNumber(line,idx_ptr);
    if (-1 < (int)uVar3) {
      sVar6 = *idx_ptr;
      pcVar7 = (line->_M_dataplus)._M_p;
      if (pcVar7[sVar6] == ':') {
        *idx_ptr = sVar6 + 1;
        uVar4 = ParseNumber(line,idx_ptr);
        if ((int)uVar4 < 0) {
          return uVar4;
        }
        if (0x3b < uVar4) {
          return -1;
        }
        sVar6 = *idx_ptr;
        pcVar7 = (line->_M_dataplus)._M_p;
        if (pcVar7[sVar6] == ':') {
          time->hours = uVar3;
          time->minutes = uVar4;
          *idx_ptr = sVar6 + 1;
          uVar3 = ParseNumber(line,idx_ptr);
          if ((int)uVar3 < 0) {
            return uVar3;
          }
          if (0x3b < uVar3) {
            return -1;
          }
          time->seconds = uVar3;
          sVar6 = *idx_ptr;
          pcVar7 = (line->_M_dataplus)._M_p;
        }
        else {
          if (0x3b < uVar3) {
            return -1;
          }
          time->hours = 0;
          time->minutes = uVar3;
          time->seconds = uVar4;
        }
      }
      else {
        time->seconds = uVar3 % 0x3c;
        time->hours = uVar3 / 0xe10;
        time->minutes = (uVar3 / 0xe10) * -0x3c + uVar3 / 0x3c;
      }
      uVar3 = 0;
      if (pcVar7[sVar6] == '.') {
        *idx_ptr = sVar6 + 1;
        uVar4 = ParseNumber(line,idx_ptr);
        if ((int)uVar4 < 0) {
          return uVar4;
        }
        if (999 < uVar4) {
          return -1;
        }
        if (uVar4 < 10) {
          uVar3 = uVar4 * 100;
        }
        else {
          uVar3 = uVar4 * 10;
          if (99 < uVar4) {
            uVar3 = uVar4;
          }
        }
      }
      time->milliseconds = uVar3;
      uVar5 = (ulong)(byte)(line->_M_dataplus)._M_p[*idx_ptr];
      uVar3 = uVar2;
      if ((uVar5 < 0x21) && ((0x100000201U >> (uVar5 & 0x3f) & 1) != 0)) {
        uVar3 = 0;
      }
    }
  }
  return uVar3;
}

Assistant:

int Parser::ParseTime(const std::string& line, std::string::size_type* idx_ptr,
                      Time* time) {
  if (idx_ptr == NULL)
    return -1;

  std::string::size_type& idx = *idx_ptr;

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  if (time == NULL)
    return -1;

  // Consume any whitespace that precedes the timestamp.

  while (char c = line[idx]) {
    if (c != kSPACE && c != kTAB)
      break;
    ++idx;
  }

  // WebVTT timestamp syntax comes in three flavors:
  //  SS[.sss]
  //  MM:SS[.sss]
  //  HH:MM:SS[.sss]

  // Parse a generic number value.  We don't know which component
  // of the time we have yet, until we do more parsing.

  int val = ParseNumber(line, &idx);

  if (val < 0)  // error
    return val;

  Time& t = *time;

  // The presence of a colon character indicates that we have
  // an [HH:]MM:SS style syntax.

  if (line[idx] == ':') {
    // We have either HH:MM:SS or MM:SS

    // The value we just parsed is either the hours or minutes.
    // It must be followed by another number value (that is
    // either minutes or seconds).

    const int first_val = val;

    ++idx;  // consume colon

    // Parse second value

    val = ParseNumber(line, &idx);

    if (val < 0)
      return val;

    if (val >= 60)  // either MM or SS
      return -1;

    if (line[idx] == ':') {
      // We have HH:MM:SS

      t.hours = first_val;
      t.minutes = val;  // vetted above

      ++idx;  // consume MM:SS colon

      // We have parsed the hours and minutes.
      // We must now parse the seconds.

      val = ParseNumber(line, &idx);

      if (val < 0)
        return val;

      if (val >= 60)  // SS part of HH:MM:SS
        return -1;

      t.seconds = val;
    } else {
      // We have MM:SS

      // The implication here is that the hour value was omitted
      // from the timestamp (because it was 0).

      if (first_val >= 60)  // minutes
        return -1;

      t.hours = 0;
      t.minutes = first_val;
      t.seconds = val;  // vetted above
    }
  } else {
    // We have SS (only)

    // The time is expressed as total number of seconds,
    // so the seconds value has no upper bound.

    t.seconds = val;

    // Convert SS to HH:MM:SS

    t.minutes = t.seconds / 60;
    t.seconds -= t.minutes * 60;

    t.hours = t.minutes / 60;
    t.minutes -= t.hours * 60;
  }

  // We have parsed the hours, minutes, and seconds.
  // We must now parse the milliseconds.

  char c = line[idx];

  // TODO(matthewjheaney): one option here is to slightly relax the
  // syntax rules for WebVTT timestamps, to permit the comma character
  // to also be used as the seconds/milliseconds separator.  This
  // would handle streams that use localization conventions for
  // countries in Western Europe.  For now we obey the rules specified
  // in the WebVTT spec (allow "full stop" only).

  const bool have_milliseconds = (c == '.');

  if (!have_milliseconds) {
    t.milliseconds = 0;
  } else {
    ++idx;  // consume FULL STOP

    val = ParseNumber(line, &idx);

    if (val < 0)
      return val;

    if (val >= 1000)
      return -1;

    if (val < 10)
      t.milliseconds = val * 100;
    else if (val < 100)
      t.milliseconds = val * 10;
    else
      t.milliseconds = val;
  }

  // We have parsed the time proper.  We must check for any
  // junk that immediately follows the time specifier.

  c = line[idx];

  if (c != kNUL && c != kSPACE && c != kTAB)
    return -1;

  return 0;  // success
}